

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setvar(char *name,int i,bool dofunc,bool doclamp)

{
  int iVar1;
  ident *this;
  ident *id;
  bool doclamp_local;
  bool dofunc_local;
  char *pcStack_10;
  int i_local;
  char *name_local;
  
  pcStack_10 = name;
  this = hashset<ident>::access<char_const*>(&idents,&stack0xfffffffffffffff0);
  if ((this != (ident *)0x0) && (this->type == 0)) {
    if (((identflags & 0x10U) == 0) && ((this->flags & 2U) == 0)) {
      if ((this->flags & 0x10U) != 0) {
        this->flags = this->flags & 0xffffffef;
      }
    }
    else {
      if ((this->flags & 1U) != 0) {
        debugcode("cannot override persistent variable %s",this->name);
        return;
      }
      if ((this->flags & 0x10U) == 0) {
        (this->field_5).argmask = *(uint *)(this->field_4).args;
        this->flags = this->flags | 0x10;
      }
    }
    if (doclamp) {
      iVar1 = clamp<int,int>(i,(this->field_2).minval,(this->field_3).maxval);
      *(int *)(this->field_4).args = iVar1;
    }
    else {
      *(int *)(this->field_4).args = i;
    }
    if (dofunc) {
      ident::changed(this);
    }
  }
  return;
}

Assistant:

void setvar(const char *name, int i, bool dofunc, bool doclamp)
{
    GETVAR(id, name, );
    OVERRIDEVAR(return, id->overrideval.i = *id->storage.i, , )
    if(doclamp) *id->storage.i = clamp(i, id->minval, id->maxval);
    else *id->storage.i = i;
    if(dofunc) id->changed();
}